

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pAngle.cpp
# Opt level: O0

void __thiscall
OpenMD::pAngle::pAngle
          (pAngle *this,SimInfo *info,string *filename,string *sele1,int seleOffset,int seleOffset2,
          int nthetabins)

{
  bool bVar1;
  string *in_RCX;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  undefined4 in_stack_00000008;
  SimInfo *in_stack_00000018;
  SelectionEvaluator *in_stack_00000020;
  SimInfo *in_stack_000001c8;
  SelectionManager *in_stack_000001d0;
  string *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  SimInfo *in_stack_ffffffffffffff28;
  string *str;
  StaticAnalyser *in_stack_ffffffffffffff30;
  SelectionManager *this_00;
  undefined8 *__new_size;
  vector<double,_std::allocator<double>_> *this_01;
  SelectionEvaluator *this_02;
  string *script;
  SelectionEvaluator *in_stack_ffffffffffffff70;
  string local_78 [32];
  string local_58 [48];
  undefined4 local_28;
  undefined4 local_24;
  string *local_20;
  
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_20 = in_RCX;
  StaticAnalyser::StaticAnalyser
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
             (string *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
             (uint)((ulong)in_stack_ffffffffffffff18 >> 0x20));
  *in_RDI = &PTR__pAngle_0055fd20;
  *(undefined1 *)(in_RDI + 0x1a) = 0;
  *(undefined1 *)((long)in_RDI + 0xd1) = 1;
  *(undefined1 *)((long)in_RDI + 0xd2) = 1;
  script = (string *)(in_RDI + 0x1b);
  std::__cxx11::string::string((string *)script,local_20);
  std::__cxx11::string::string((string *)(in_RDI + 0x1f));
  this_02 = (SelectionEvaluator *)(in_RDI + 0x23);
  SelectionManager::SelectionManager(in_stack_000001d0,in_stack_000001c8);
  SelectionManager::SelectionManager(in_stack_000001d0,in_stack_000001c8);
  this_01 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x55);
  SelectionEvaluator::SelectionEvaluator(in_stack_00000020,in_stack_00000018);
  __new_size = in_RDI + 0xff;
  SelectionEvaluator::SelectionEvaluator(in_stack_00000020,in_stack_00000018);
  *(undefined4 *)(in_RDI + 0x1a9) = local_24;
  *(undefined4 *)((long)in_RDI + 0xd4c) = local_28;
  *(undefined4 *)((long)in_RDI + 0xd54) = in_stack_00000008;
  str = (string *)(in_RDI + 0x1ab);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x19f359);
  this_00 = (SelectionManager *)(in_RDI + 0x1ae);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x19f36f);
  getPrefix(str);
  std::operator+(str,(char *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  StaticAnalyser::setOutputName
            ((StaticAnalyser *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff18);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  SelectionEvaluator::loadScriptString(in_stack_ffffffffffffff70,script);
  bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x55));
  if (!bVar1) {
    SelectionEvaluator::evaluate(this_02);
    SelectionManager::setSelectionSet(this_00,(SelectionSet *)str);
    SelectionSet::~SelectionSet((SelectionSet *)0x19f448);
  }
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)this_01,(size_type)__new_size);
  std::vector<double,_std::allocator<double>_>::resize(this_01,(size_type)__new_size);
  return;
}

Assistant:

pAngle::pAngle(SimInfo* info, const std::string& filename,
                 const std::string& sele1, int seleOffset, int seleOffset2,
                 int nthetabins) :
      StaticAnalyser(info, filename, nthetabins),
      doVect_(false), doOffset_(true), doOffset2_(true),
      selectionScript1_(sele1), seleMan1_(info), seleMan2_(info),
      evaluator1_(info), evaluator2_(info), seleOffset_(seleOffset),
      seleOffset2_(seleOffset2), nThetaBins_(nthetabins) {
    setOutputName(getPrefix(filename) + ".pAngle");

    evaluator1_.loadScriptString(sele1);
    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    count_.resize(nThetaBins_);
    histogram_.resize(nThetaBins_);
  }